

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::CartesianProductGenerator<int,int>::
IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>>::AdvanceIfEnd<1ul>
          (IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<int>::operator!=
                    ((ParamIterator<int> *)(this + 0x30),(ParamIterator<int> *)(this + 0x20));
  if (bVar1) {
    return;
  }
  ParamIterator<int>::operator=
            ((ParamIterator<int> *)(this + 0x30),(ParamIterator<int> *)(this + 0x10));
  (**(code **)(**(long **)(this + 0x38) + 0x18))();
  AdvanceIfEnd<0ul>(this);
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }